

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

void leveldb::PutVarint64(string *dst,uint64_t v)

{
  long lVar1;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  char *ptr;
  char buf [10];
  uint64_t in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  EncodeVarint64(in_RSI,in_stack_ffffffffffffffd0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_stack_ffffffffffffffe8,in_RDI,(size_type)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PutVarint64(std::string* dst, uint64_t v) {
  char buf[10];
  char* ptr = EncodeVarint64(buf, v);
  dst->append(buf, ptr - buf);
}